

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::ProducerIPCService::RegisterDataSource
          (ProducerIPCService *this,RegisterDataSourceRequest *req,
          DeferredRegisterDataSourceResponse *response)

{
  _Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false> _Var1;
  ProducerEndpoint *pPVar2;
  RemoteProducer *pRVar3;
  pointer *__ptr;
  AsyncResult<perfetto::protos::gen::RegisterDataSourceResponse> local_28;
  
  pRVar3 = GetProducerForCurrentRequest(this);
  if (pRVar3 == (RemoteProducer *)0x0) {
    if ((response->super_DeferredBase).callback_.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      ipc::DeferredBase::Reject(&response->super_DeferredBase);
      return;
    }
  }
  else {
    _Var1._M_head_impl =
         (req->data_source_descriptor_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
         .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>._M_head_impl;
    pRVar3 = GetProducerForCurrentRequest(this);
    pPVar2 = (pRVar3->service_endpoint)._M_t.
             super___uniq_ptr_impl<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::ProducerEndpoint_*,_std::default_delete<perfetto::ProducerEndpoint>_>
             .super__Head_base<0UL,_perfetto::ProducerEndpoint_*,_false>._M_head_impl;
    (*pPVar2->_vptr_ProducerEndpoint[2])(pPVar2,_Var1._M_head_impl);
    if ((response->super_DeferredBase).callback_.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      ipc::AsyncResult<perfetto::protos::gen::RegisterDataSourceResponse>::Create();
      ipc::Deferred<perfetto::protos::gen::RegisterDataSourceResponse>::Resolve(response,&local_28);
      if (local_28.msg_._M_t.
          super___uniq_ptr_impl<perfetto::protos::gen::RegisterDataSourceResponse,_std::default_delete<perfetto::protos::gen::RegisterDataSourceResponse>_>
          ._M_t.
          super__Tuple_impl<0UL,_perfetto::protos::gen::RegisterDataSourceResponse_*,_std::default_delete<perfetto::protos::gen::RegisterDataSourceResponse>_>
          .super__Head_base<0UL,_perfetto::protos::gen::RegisterDataSourceResponse_*,_false>.
          _M_head_impl !=
          (__uniq_ptr_impl<perfetto::protos::gen::RegisterDataSourceResponse,_std::default_delete<perfetto::protos::gen::RegisterDataSourceResponse>_>
           )0x0) {
        (*((CppMessageObj *)
          local_28.msg_._M_t.
          super___uniq_ptr_impl<perfetto::protos::gen::RegisterDataSourceResponse,_std::default_delete<perfetto::protos::gen::RegisterDataSourceResponse>_>
          ._M_t.
          super__Tuple_impl<0UL,_perfetto::protos::gen::RegisterDataSourceResponse_*,_std::default_delete<perfetto::protos::gen::RegisterDataSourceResponse>_>
          .super__Head_base<0UL,_perfetto::protos::gen::RegisterDataSourceResponse_*,_false>.
          _M_head_impl)->_vptr_CppMessageObj[1])();
      }
    }
  }
  return;
}

Assistant:

void ProducerIPCService::RegisterDataSource(
    const protos::gen::RegisterDataSourceRequest& req,
    DeferredRegisterDataSourceResponse response) {
  RemoteProducer* producer = GetProducerForCurrentRequest();
  if (!producer) {
    PERFETTO_DLOG(
        "Producer invoked RegisterDataSource() before InitializeConnection()");
    if (response.IsBound())
      response.Reject();
    return;
  }

  const DataSourceDescriptor& dsd = req.data_source_descriptor();
  GetProducerForCurrentRequest()->service_endpoint->RegisterDataSource(dsd);

  // RegisterDataSource doesn't expect any meaningful response.
  if (response.IsBound()) {
    response.Resolve(
        ipc::AsyncResult<protos::gen::RegisterDataSourceResponse>::Create());
  }
}